

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hamt_set.hpp
# Opt level: O1

value_type * __thiscall
pstore::index::
hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
::load_leaf_node(value_type *__return_storage_ptr__,
                hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                *this,database *db,address addr)

{
  span<unsigned_char,__1L> sp;
  size_t __nbytes;
  type uninit_buffer;
  database *local_48;
  value_type local_40;
  extent_type<_1L> in_stack_ffffffffffffffc8;
  pointer in_stack_ffffffffffffffd0;
  anon_union_8_2_d34ab9e4_for_indirect_string_3 local_28;
  
  sp.storage_.data_ = in_stack_ffffffffffffffd0;
  sp.storage_.super_extent_type<_1L>.size_ = in_stack_ffffffffffffffc8.size_;
  local_48 = db;
  local_40 = addr.a_;
  serialize::flood<_1l>(sp);
  serialize::serializer<pstore::indirect_string,_void>::read
            ((int)&local_48,&stack0xffffffffffffffc8,__nbytes);
  __return_storage_ptr__->field_2 = local_28;
  __return_storage_ptr__->db_ = (database *)in_stack_ffffffffffffffc8.size_;
  *(pointer *)&__return_storage_ptr__->is_pointer_ = in_stack_ffffffffffffffd0;
  return __return_storage_ptr__;
}

Assistant:

value_type load_leaf_node (database const & db, address const addr) const {
                return map_.load_leaf_node (db, addr).first;
            }